

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onconnect.c
# Opt level: O0

int handle_signal(void)

{
  uint uVar1;
  ssize_t sVar2;
  int local_90;
  pid_t pid;
  int rc;
  int es;
  signalfd_siginfo info;
  
  local_90 = -1;
  sVar2 = read(cfg.signal_fd,&rc,0x80);
  if (sVar2 == 0x80) {
    if (rc == 0xe) {
      cfg.ticks = cfg.ticks + 1;
      if (cfg.ticks % 10 == 0) {
        periodic();
      }
      alarm(1);
    }
    else {
      if (rc != 0x11) {
        fprintf(_stderr,"got signal %d\n",(ulong)(uint)rc);
        return -1;
      }
      while (uVar1 = waitpid(-1,&pid,1), 0 < (int)uVar1) {
        if ('\0' < (char)(((byte)pid & 0x7f) + 1) >> 1) {
          fprintf(_stderr,"pid %d exited: signal %d\n",(ulong)uVar1,(ulong)(pid & 0x7f));
        }
        if ((pid & 0x7fU) == 0) {
          fprintf(_stderr,"pid %d exited: status %d\n",(ulong)uVar1,
                  (ulong)(uint)((int)(pid & 0xff00U) >> 8));
        }
      }
    }
    local_90 = 0;
  }
  else {
    fprintf(_stderr,"failed to read signal fd buffer\n");
  }
  return local_90;
}

Assistant:

int handle_signal() {
  struct signalfd_siginfo info;
  int es, rc = -1;
  pid_t pid;

  if (read(cfg.signal_fd, &info, sizeof(info)) != sizeof(info)) {
    fprintf(stderr,"failed to read signal fd buffer\n");
    goto done;
  }

  switch (info.ssi_signo) {
    case SIGALRM: 
      if ((++cfg.ticks % 10) == 0) periodic(); 
      alarm(1); 
      break;
    case SIGCHLD:  /* collect children to avoid leaving zombie processes */
      while ( (pid = waitpid(-1, &es, WNOHANG)) > 0) {
        if (WIFSIGNALED(es)) {
          fprintf(stderr, "pid %d exited: signal %d\n", pid, (int)WTERMSIG(es));
        }
        if (WIFEXITED(es)) {
          fprintf(stderr, "pid %d exited: status %d\n", pid, (int)WEXITSTATUS(es));
        }
      }
      break;
    default:  /* exit */
      /* TODO on termination, signal forked processes */
      fprintf(stderr,"got signal %d\n", info.ssi_signo);  
      goto done;
  }

  rc = 0;

 done:
  return rc;
}